

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O1

double sptk::Warp(double omega,double alpha,double theta)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  if ((((alpha != 0.0) || (NAN(alpha))) || (theta != 0.0)) || (NAN(theta))) {
    dVar1 = sin(omega - theta);
    dVar2 = cos(omega - theta);
    dVar1 = atan2(dVar1 * alpha,1.0 - dVar2 * alpha);
    dVar2 = sin(theta + omega);
    dVar3 = cos(theta + omega);
    dVar2 = atan2(dVar2 * alpha,1.0 - dVar3 * alpha);
    omega = dVar2 + dVar1 + omega;
  }
  return omega;
}

Assistant:

double Warp(double omega, double alpha, double theta) {
  if (0.0 == alpha && 0.0 == theta) return omega;
  const double x(omega - theta);
  const double y(omega + theta);
  return (omega + std::atan2(alpha * std::sin(x), 1.0 - alpha * std::cos(x)) +
          std::atan2(alpha * std::sin(y), 1.0 - alpha * std::cos(y)));
}